

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inspector.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  _List_node_base *p_Var1;
  pointer paVar2;
  bool bVar3;
  FUNCTION_RETURN FVar4;
  LCC_EVENT_TYPE LVar5;
  ostream *poVar6;
  _Base_ptr p_Var7;
  const_iterator cVar8;
  int i;
  long lVar9;
  _List_node_base *p_Var10;
  char *pcVar11;
  pointer __src;
  LCC_EVENT_TYPE local_2db8;
  ExecutionEnvironmentInfo exec_env_info;
  string fname;
  size_t bufSize;
  vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_> adapterInfos;
  string section_name;
  TNamesDepend sections;
  CpuInfo cpu;
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> local_2cd8;
  DmiInfo dmi_info;
  CallerInformations callerInformation;
  char hw_identifier [20];
  ifstream license_file;
  int aiStack_2b78 [123];
  anon_struct_1044_5_0902c47b osAdapter;
  LicenseLocation licLocation;
  
  bufSize = 0x14;
  for (p_Var7 = stringByStrategyId_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != &stringByStrategyId_abi_cxx11_._M_t._M_impl.super__Rb_tree_header
      ; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    bVar3 = identify_pc(p_Var7[1]._M_color,hw_identifier,&bufSize,&exec_env_info);
    poVar6 = std::operator<<((ostream *)&std::cout,(string *)&p_Var7[1]._M_parent);
    if (bVar3) {
      poVar6 = std::operator<<(poVar6,':');
      pcVar11 = hw_identifier;
    }
    else {
      pcVar11 = ": NA";
    }
    poVar6 = std::operator<<(poVar6,pcVar11);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"Virtualiz. class :");
  osAdapter.id = exec_env_info.virtualization;
  cVar8 = std::
          _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&descByVirt_abi_cxx11_._M_h,&osAdapter.id);
  poVar6 = std::operator<<(poVar6,(string *)
                                  ((long)cVar8.
                                         super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                         ._M_cur + 0x10));
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cout,"Virtualiz. detail:");
  osAdapter.id = exec_env_info.virtualization_detail;
  cVar8 = std::
          _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&descByVirtDetail_abi_cxx11_._M_h,&osAdapter.id);
  poVar6 = std::operator<<(poVar6,(string *)
                                  ((long)cVar8.
                                         super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                         ._M_cur + 0x10));
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cout,"Cloud provider   :");
  osAdapter.id = exec_env_info.cloud_provider;
  cVar8 = std::
          _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&descByCloudProvider_abi_cxx11_._M_h,&osAdapter.id);
  poVar6 = std::operator<<(poVar6,(string *)
                                  ((long)cVar8.
                                         super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                         ._M_cur + 0x10));
  std::endl<char,std::char_traits<char>>(poVar6);
  adapterInfos.
  super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  adapterInfos.
  super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  adapterInfos.
  super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FVar4 = license::os::getAdapterInfos(&adapterInfos);
  paVar2 = adapterInfos.
           super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __src = adapterInfos.
          super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
          ._M_impl.super__Vector_impl_data._M_start;
  if (FVar4 != FUNC_RET_OK) {
    poVar6 = std::operator<<((ostream *)&std::cout,"problem in getting adapter informations:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,FVar4);
    std::endl<char,std::char_traits<char>>(poVar6);
LAB_0016b1ca:
    license::os::CpuInfo::CpuInfo(&cpu);
    poVar6 = std::operator<<((ostream *)&std::cout,"Cpu Vendor       :");
    poVar6 = std::operator<<(poVar6,(string *)&cpu.m_vendor);
    std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<((ostream *)&std::cout,"Cpu Brand        :");
    poVar6 = std::operator<<(poVar6,(string *)&cpu.m_brand);
    std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<((ostream *)&std::cout,"Cpu hypervisor   :");
    license::os::CpuInfo::is_hypervisor_set(&cpu);
    poVar6 = std::ostream::_M_insert<bool>(SUB81(poVar6,0));
    std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<((ostream *)&std::cout,"Cpu model        :0x");
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
    license::os::CpuInfo::model(&cpu);
    poVar6 = std::ostream::_M_insert<long>((long)poVar6);
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::endl<char,std::char_traits<char>>(poVar6);
    license::os::DmiInfo::DmiInfo(&dmi_info);
    poVar6 = std::operator<<((ostream *)&std::cout,"Bios vendor      :");
    poVar6 = std::operator<<(poVar6,(string *)&dmi_info.m_bios_vendor);
    std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<((ostream *)&std::cout,"Bios description :");
    poVar6 = std::operator<<(poVar6,(string *)&dmi_info.m_bios_description);
    std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<((ostream *)&std::cout,"System vendor    :");
    poVar6 = std::operator<<(poVar6,(string *)&dmi_info.m_sys_vendor);
    std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<((ostream *)&std::cout,"Cpu Vendor (dmi) :");
    poVar6 = std::operator<<(poVar6,(string *)&dmi_info.m_cpu_manufacturer);
    std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<((ostream *)&std::cout,"Cpu Cores  (dmi) :");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<((ostream *)&std::cout,"==================");
    std::endl<char,std::char_traits<char>>(poVar6);
    if (argc == 2) {
      std::__cxx11::string::string((string *)&fname,argv[1],(allocator *)&osAdapter);
      std::ifstream::ifstream(&license_file,(string *)&fname,_S_in);
      if (*(int *)((long)aiStack_2b78 + *(long *)(_license_file + -0x18)) == 0) {
        memset(&licLocation,0,0x1004);
        if (fname._M_string_length != 0) {
          memmove(licLocation.licenseData,fname._M_dataplus._M_p,fname._M_string_length);
        }
        LVar5 = acquire_license((CallerInformations *)0x0,&licLocation,(LicenseInfo *)&osAdapter);
        if (LVar5 == LICENSE_OK) {
          poVar6 = std::operator<<((ostream *)&std::cout,"default project [");
          poVar6 = std::operator<<(poVar6,"DEFAULT");
          poVar6 = std::operator<<(poVar6,"]: license OK");
          std::endl<char,std::char_traits<char>>(poVar6);
        }
        else {
          poVar6 = std::operator<<((ostream *)&std::cerr,"default project [");
          poVar6 = std::operator<<(poVar6,"DEFAULT");
          poVar6 = std::operator<<(poVar6,"]:");
          local_2cd8.m_pData = (char *)CONCAT44(local_2cd8.m_pData._4_4_,LVar5);
          cVar8 = std::
                  _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&stringByEventType_abi_cxx11_._M_h,(key_type *)&local_2cd8);
          poVar6 = std::operator<<(poVar6,(string *)
                                          ((long)cVar8.
                                                 super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                                 ._M_cur + 0x10));
          std::endl<char,std::char_traits<char>>(poVar6);
        }
        local_2cd8.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_2cd8.m_data._M_t._M_impl.super__Rb_tree_header._M_header;
        local_2cd8.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_2cd8.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_2cd8.m_pData = (char *)0x0;
        local_2cd8.m_uDataLen = 0;
        local_2cd8.m_pFileComment = (char *)0x0;
        local_2cd8.m_data._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_2cd8.m_strings.
        super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
        ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_2cd8.m_strings;
        local_2cd8.m_strings.
        super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
        ._M_impl._M_node._M_size._0_7_ = 0;
        local_2cd8._95_4_ = 0;
        local_2cd8.m_bSpaces = true;
        local_2cd8.m_nOrder = 0;
        local_2cd8.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_2cd8.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_2cd8.m_strings.
        super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
        ._M_impl._M_node.super__List_node_base._M_prev =
             local_2cd8.m_strings.
             super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
             ._M_impl._M_node.super__List_node_base._M_next;
        CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::LoadFile
                  (&local_2cd8,fname._M_dataplus._M_p);
        sections.
        super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
        ._M_impl._M_node._M_size = 0;
        sections.
        super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
        ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&sections;
        sections.
        super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
        ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&sections;
        CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetAllSections
                  (&local_2cd8,&sections);
        p_Var10 = (_List_node_base *)&sections;
        while (p_Var10 = (((_List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                            *)&p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
              p_Var10 != (_List_node_base *)&sections) {
          p_Var1 = p_Var10[1]._M_next;
          section_name._M_dataplus._M_p = (pointer)&section_name.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&section_name,p_Var1,(undefined1 *)((long)&p_Var1->_M_prev + 7));
          bVar3 = std::operator!=(&section_name,"DEFAULT");
          if (bVar3) {
            if (section_name._M_string_length != 0) {
              memmove(callerInformation.feature_name,section_name._M_dataplus._M_p,
                      section_name._M_string_length);
            }
            LVar5 = acquire_license(&callerInformation,&licLocation,(LicenseInfo *)&osAdapter);
            if (LVar5 == LICENSE_OK) {
              poVar6 = std::operator<<((ostream *)&std::cout,"project [");
              poVar6 = std::operator<<(poVar6,(char *)p_Var1);
              poVar6 = std::operator<<(poVar6,"]: license OK");
              std::endl<char,std::char_traits<char>>(poVar6);
            }
            else {
              poVar6 = std::operator<<((ostream *)&std::cerr,"project [");
              poVar6 = std::operator<<(poVar6,(char *)p_Var1);
              poVar6 = std::operator<<(poVar6,"]");
              local_2db8 = LVar5;
              cVar8 = std::
                      _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::find(&stringByEventType_abi_cxx11_._M_h,(key_type *)&local_2db8);
              poVar6 = std::operator<<(poVar6,(string *)
                                              ((long)cVar8.
                                                  super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                                  ._M_cur + 0x10));
              std::endl<char,std::char_traits<char>>(poVar6);
            }
          }
          std::__cxx11::string::~string((string *)&section_name);
        }
        std::__cxx11::
        _List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
        ::_M_clear(&sections.
                    super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                  );
        CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::~CSimpleIniTempl
                  (&local_2cd8);
      }
      else {
        poVar6 = std::operator<<((ostream *)&std::cerr,"license file :");
        poVar6 = std::operator<<(poVar6,(string *)&fname);
        poVar6 = std::operator<<(poVar6," not found.");
        std::endl<char,std::char_traits<char>>(poVar6);
      }
      std::ifstream::~ifstream(&license_file);
      std::__cxx11::string::~string((string *)&fname);
    }
    license::os::DmiInfo::~DmiInfo(&dmi_info);
    license::os::CpuInfo::~CpuInfo(&cpu);
    std::_Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>::
    ~_Vector_base(&adapterInfos.
                   super__Vector_base<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
                 );
    return 0;
  }
LAB_0016b470:
  if (__src != paVar2) {
    memcpy(&osAdapter,__src,0x414);
    poVar6 = std::operator<<((ostream *)&std::cout,"Network adapter [");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,osAdapter.id);
    poVar6 = std::operator<<(poVar6,"]: ");
    poVar6 = std::operator<<(poVar6,osAdapter.description);
    std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<((ostream *)&std::cout,"   ip address [");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6,"-");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6,"-");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6,"-");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6,"]");
    std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<((ostream *)&std::cout,"   mac address [");
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
    lVar9 = 0;
    do {
      if (lVar9 != 0) {
        if (lVar9 == 6) goto LAB_0016b5ab;
        std::operator<<((ostream *)&std::cout,":");
      }
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      lVar9 = lVar9 + 1;
    } while( true );
  }
  goto LAB_0016b1ca;
LAB_0016b5ab:
  poVar6 = std::operator<<((ostream *)&std::cout,"]");
  *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
       *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::endl<char,std::char_traits<char>>(poVar6);
  __src = __src + 1;
  goto LAB_0016b470;
}

Assistant:

int main(int argc, char* argv[]) {
	char hw_identifier[LCC_API_PC_IDENTIFIER_SIZE + 1];
	size_t bufSize = LCC_API_PC_IDENTIFIER_SIZE + 1;
	ExecutionEnvironmentInfo exec_env_info;
	for (const auto& x : stringByStrategyId) {
		if (identify_pc(static_cast<LCC_API_HW_IDENTIFICATION_STRATEGY>(x.first), hw_identifier, &bufSize,
						&exec_env_info)) {
			std::cout << x.second << ':' << hw_identifier << std::endl;
		} else {
			std::cout << x.second << ": NA" << endl;
		}
	}
	cout << "Virtualiz. class :" << descByVirt.find(exec_env_info.virtualization)->second << endl;
	cout << "Virtualiz. detail:" << descByVirtDetail.find(exec_env_info.virtualization_detail)->second << endl;
	cout << "Cloud provider   :" << descByCloudProvider.find(exec_env_info.cloud_provider)->second << endl;

	std::vector<license::os::OsAdapterInfo> adapterInfos;
	FUNCTION_RETURN ret = license::os::getAdapterInfos(adapterInfos);
	if (ret == FUNCTION_RETURN::FUNC_RET_OK) {
		for (auto osAdapter : adapterInfos) {
			cout << "Network adapter [" << osAdapter.id << "]: " << osAdapter.description << endl;
			cout << "   ip address [" << static_cast<unsigned int>(osAdapter.ipv4_address[3]) << "-"
				 << static_cast<unsigned int>(osAdapter.ipv4_address[2]) << "-"
				 << static_cast<unsigned int>(osAdapter.ipv4_address[1]) << "-"
				 << static_cast<unsigned int>(osAdapter.ipv4_address[0]) << "]" << endl;
			cout << "   mac address [" << std::hex;
			for (int i = 0; i < sizeof(osAdapter.mac_address); i++) {
				if (i != 0) {
					cout << ":";
				}
				cout << static_cast<unsigned int>(osAdapter.mac_address[i]);
			}
			cout << "]" << std::dec << endl;
		}
	} else {
		cout << "problem in getting adapter informations:" << ret << endl;
	}

	license::os::CpuInfo cpu;
	cout << "Cpu Vendor       :" << cpu.vendor() << endl;
	cout << "Cpu Brand        :" << cpu.brand() << endl;
	cout << "Cpu hypervisor   :" << cpu.is_hypervisor_set() << endl;
	cout << "Cpu model        :0x" << std::hex << ((long)cpu.model()) << std::dec << endl;
	license::os::DmiInfo dmi_info;
	cout << "Bios vendor      :" << dmi_info.bios_vendor() << endl;
	cout << "Bios description :" << dmi_info.bios_description() << endl;
	cout << "System vendor    :" << dmi_info.sys_vendor() << endl;
	cout << "Cpu Vendor (dmi) :" << dmi_info.cpu_manufacturer() << endl;
	cout << "Cpu Cores  (dmi) :" << dmi_info.cpu_cores() << endl;
	cout << "==================" << endl;
	if (argc == 2) {
		const string fname(argv[1]);
		ifstream license_file(fname);
		if (license_file.good()) {
			verifyLicense(fname);
		} else {
			cerr << "license file :" << fname << " not found." << endl;
		}
	}
	bool find_license_with_env_var = FIND_LICENSE_WITH_ENV_VAR;
	if (find_license_with_env_var) {
		char* env_var_value = getenv(LCC_LICENSE_LOCATION_ENV_VAR);
		if (env_var_value != nullptr && env_var_value[0] != '\0') {
			cout << "environment variable [" << LCC_LICENSE_LOCATION_ENV_VAR << "] value [" << env_var_value << "]"
				 << endl;
			const vector<string> declared_licenses = license::split_string(string(env_var_value), ';');
			for (string fname : declared_licenses) {
				ifstream license_file(fname);
				if (license_file.good()) {
					verifyLicense(fname);
				} else {
					cerr << "license file :" << fname << " not found." << endl;
				}
			}
		} else {
			cout << "environment variable [" << LCC_LICENSE_LOCATION_ENV_VAR << "] configured but not defined." << endl;
		}
	}
}